

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_vector3.h
# Opt level: O0

_vector3<double> * __thiscall
xray_re::_vector3<double>::rotate(_vector3<double> *this,_matrix<double> *m)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double _y;
  double _x;
  _matrix<double> *m_local;
  _vector3<double> *this_local;
  
  dVar1 = (m->field_0).field_0._11;
  dVar2 = (m->field_0).field_0._21;
  dVar3 = (m->field_0).field_0._31;
  dVar4 = (this->field_0).field_0.z;
  dVar5 = (m->field_0).field_0._12;
  dVar6 = (this->field_0).field_0.x;
  dVar7 = (m->field_0).field_0._22;
  dVar8 = (m->field_0).field_0._32;
  dVar9 = (this->field_0).field_0.z;
  (this->field_0).field_0.z =
       (m->field_0).field_0._33 * (this->field_0).field_0.z +
       (m->field_0).field_0._13 * (this->field_0).field_0.x +
       (m->field_0).field_0._23 * (this->field_0).field_0.y;
  (this->field_0).field_0.x =
       dVar3 * dVar4 + dVar1 * (this->field_0).field_0.x + dVar2 * (this->field_0).field_0.y;
  (this->field_0).field_0.y = dVar8 * dVar9 + dVar5 * dVar6 + dVar7 * (this->field_0).field_0.y;
  return this;
}

Assistant:

inline _vector3<T>& _vector3<T>::rotate(const _matrix<T>& m)
{
	T _x = m._11*x + m._21*y + m._31*z;
	T _y = m._12*x + m._22*y + m._32*z;
	z = m._13*x + m._23*y + m._33*z;
	x = _x;
	y = _y;
	return *this;
}